

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_andnot_inplace(void **param_1)

{
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *expression;
  roaring64_bitmap_t *b;
  roaring64_bitmap_t *prVar1;
  roaring64_bitmap_t *in_RDI;
  roaring64_bitmap_t *r2_1;
  roaring64_bitmap_t *r1_1;
  roaring64_bitmap_t *r2;
  roaring64_bitmap_t *r1;
  uint64_t in_stack_00000028;
  uint64_t in_stack_00000030;
  uint64_t in_stack_00000038;
  roaring64_bitmap_t *in_stack_00000070;
  roaring64_bitmap_t *in_stack_00000168;
  roaring64_bitmap_t *in_stack_00000170;
  undefined8 in_stack_ffffffffffffffd8;
  int iVar2;
  roaring64_bitmap_t *in_stack_ffffffffffffffe0;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  r = roaring64_bitmap_create();
  expression = roaring64_bitmap_create();
  roaring64_bitmap_add(r,(uint64_t)expression);
  roaring64_bitmap_add(r,(uint64_t)expression);
  roaring64_bitmap_add(r,(uint64_t)expression);
  roaring64_bitmap_add(r,(uint64_t)expression);
  roaring64_bitmap_add(r,(uint64_t)expression);
  roaring64_bitmap_add(r,(uint64_t)expression);
  roaring64_bitmap_add(r,(uint64_t)expression);
  roaring64_bitmap_andnot_inplace(in_stack_00000170,in_stack_00000168);
  assert_r64_valid(in_stack_ffffffffffffffe0);
  roaring64_bitmap_contains(in_RDI,(uint64_t)r);
  _assert_true((unsigned_long)r,(char *)expression,(char *)in_stack_ffffffffffffffe0,iVar2);
  roaring64_bitmap_contains(in_RDI,(uint64_t)r);
  _assert_true((unsigned_long)r,(char *)expression,(char *)in_stack_ffffffffffffffe0,iVar2);
  roaring64_bitmap_contains(in_RDI,(uint64_t)r);
  _assert_true((unsigned_long)r,(char *)expression,(char *)in_stack_ffffffffffffffe0,iVar2);
  roaring64_bitmap_contains(in_RDI,(uint64_t)r);
  _assert_true((unsigned_long)r,(char *)expression,(char *)in_stack_ffffffffffffffe0,iVar2);
  roaring64_bitmap_contains(in_RDI,(uint64_t)r);
  _assert_true((unsigned_long)r,(char *)expression,(char *)in_stack_ffffffffffffffe0,iVar2);
  roaring64_bitmap_free(in_stack_00000070);
  roaring64_bitmap_free(in_stack_00000070);
  b = roaring64_bitmap_from_range(in_stack_00000038,in_stack_00000030,in_stack_00000028);
  prVar1 = roaring64_bitmap_from_range(in_stack_00000038,in_stack_00000030,in_stack_00000028);
  iVar2 = (int)((ulong)prVar1 >> 0x20);
  roaring64_bitmap_andnot_inplace(in_stack_00000170,in_stack_00000168);
  assert_r64_valid((roaring64_bitmap_t *)b);
  roaring64_bitmap_is_empty((roaring64_bitmap_t *)0x1077e0);
  _assert_true((unsigned_long)r,(char *)expression,(char *)b,iVar2);
  roaring64_bitmap_free(in_stack_00000070);
  roaring64_bitmap_free(in_stack_00000070);
  return;
}

Assistant:

DEFINE_TEST(test_andnot_inplace) {
    {
        roaring64_bitmap_t* r1 = roaring64_bitmap_create();
        roaring64_bitmap_t* r2 = roaring64_bitmap_create();

        roaring64_bitmap_add(r1, 100000);
        roaring64_bitmap_add(r1, 100001);
        roaring64_bitmap_add(r1, 200000);
        roaring64_bitmap_add(r1, 300000);

        roaring64_bitmap_add(r2, 100001);
        roaring64_bitmap_add(r2, 200000);
        roaring64_bitmap_add(r2, 400000);

        roaring64_bitmap_andnot_inplace(r1, r2);

        assert_r64_valid(r1);
        assert_true(roaring64_bitmap_contains(r1, 100000));
        assert_false(roaring64_bitmap_contains(r1, 100001));
        assert_false(roaring64_bitmap_contains(r1, 200000));
        assert_true(roaring64_bitmap_contains(r1, 300000));
        assert_false(roaring64_bitmap_contains(r1, 400000));

        roaring64_bitmap_free(r1);
        roaring64_bitmap_free(r2);
    }
    {
        // Two identical bitmaps.
        roaring64_bitmap_t* r1 = roaring64_bitmap_from_range(0, 100, 1);
        roaring64_bitmap_t* r2 = roaring64_bitmap_from_range(0, 100, 1);

        roaring64_bitmap_andnot_inplace(r1, r2);
        assert_r64_valid(r1);
        assert_true(roaring64_bitmap_is_empty(r1));

        roaring64_bitmap_free(r1);
        roaring64_bitmap_free(r2);
    }
}